

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxDoWhileLoop::Emit(FxDoWhileLoop *this,VMFunctionBuilder *build)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  size_t loopstart_00;
  size_t loc;
  undefined1 local_78 [40];
  TArray<unsigned_long,_unsigned_long> no;
  TArray<unsigned_long,_unsigned_long> yes;
  size_t codestart;
  size_t loopend;
  size_t loopstart;
  VMFunctionBuilder *build_local;
  FxDoWhileLoop *this_local;
  
  if (this->Condition->ValueType != (PType *)TypeBool) {
    __assert_fail("Condition->ValueType == TypeBool",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x23cf,"virtual ExpEmit FxDoWhileLoop::Emit(VMFunctionBuilder *)");
  }
  sVar3 = VMFunctionBuilder::GetAddress(build);
  if (this->Code != (FxExpression *)0x0) {
    FxExpression::EmitStatement(this->Code,build);
  }
  loopstart_00 = VMFunctionBuilder::GetAddress(build);
  uVar2 = (*this->Condition->_vptr_FxExpression[3])();
  if ((uVar2 & 1) == 0) {
    TArray<unsigned_long,_unsigned_long>::TArray((TArray<unsigned_long,_unsigned_long> *)&no.Most);
    TArray<unsigned_long,_unsigned_long>::TArray
              ((TArray<unsigned_long,_unsigned_long> *)(local_78 + 0x20));
    (*this->Condition->_vptr_FxExpression[10])(this->Condition,build,1,&no.Most,local_78 + 0x20);
    VMFunctionBuilder::BackpatchList
              (build,(TArray<unsigned_long,_unsigned_long> *)(local_78 + 0x20),sVar3);
    VMFunctionBuilder::BackpatchListToHere(build,(TArray<unsigned_long,_unsigned_long> *)&no.Most);
    TArray<unsigned_long,_unsigned_long>::~TArray
              ((TArray<unsigned_long,_unsigned_long> *)(local_78 + 0x20));
    TArray<unsigned_long,_unsigned_long>::~TArray((TArray<unsigned_long,_unsigned_long> *)&no.Most);
  }
  else {
    FxConstant::GetValue((FxConstant *)local_78);
    bVar1 = ExpVal::GetBool((ExpVal *)local_78);
    ExpVal::~ExpVal((ExpVal *)local_78);
    if (bVar1) {
      loc = VMFunctionBuilder::Emit(build,0x44,0);
      VMFunctionBuilder::Backpatch(build,loc,sVar3);
    }
  }
  sVar3 = VMFunctionBuilder::GetAddress(build);
  FxLoopStatement::Backpatch(&this->super_FxLoopStatement,build,loopstart_00,sVar3);
  ExpEmit::ExpEmit((ExpEmit *)&this_local);
  return (ExpEmit)this_local;
}

Assistant:

ExpEmit FxDoWhileLoop::Emit(VMFunctionBuilder *build)
{
	assert(Condition->ValueType == TypeBool);

	size_t loopstart, loopend;
	size_t codestart;

	// Execute the loop's content.
	codestart = build->GetAddress();
	if (Code != nullptr)
	{
		Code->EmitStatement(build);
	}

	// Evaluate the condition and execute/break out of the loop.
	loopstart = build->GetAddress();
	if (!Condition->isConstant())
	{
		TArray<size_t> yes, no;
		Condition->EmitCompare(build, true, yes, no);
		build->BackpatchList(no, codestart);
		build->BackpatchListToHere(yes);
	}
	else if (static_cast<FxConstant *>(Condition)->GetValue().GetBool() == true)
	{ // Always looping
		build->Backpatch(build->Emit(OP_JMP, 0), codestart);
	}
	loopend = build->GetAddress();
	Backpatch(build, loopstart, loopend);

	return ExpEmit();
}